

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O3

ostream * embree::emitXML(ostream *cout,Ref<embree::XML> *xml,size_t depth)

{
  char cVar1;
  bool bVar2;
  long *plVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  XML *pXVar6;
  pointer pTVar7;
  pointer pTVar8;
  char *pcVar9;
  pointer pRVar10;
  _Self __tmp;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  
  cVar1 = (char)cout;
  if (depth == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(cout,"<?xml version=\"1.0\"?>",0x15);
    std::ios::widen((char)*(undefined8 *)(*(long *)cout + -0x18) + cVar1);
    std::ostream::put(cVar1);
    plVar3 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  else {
    for (lVar11 = depth * 2; lVar11 != 0; lVar11 = lVar11 + -1) {
      std::__ostream_insert<char,std::char_traits<char>>(cout," ",1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(cout,"<",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (cout,(xml->ptr->name)._M_dataplus._M_p,(xml->ptr->name)._M_string_length);
  pXVar6 = xml->ptr;
  p_Var5 = (pXVar6->parms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var5 != &(pXVar6->parms)._M_t._M_impl.super__Rb_tree_header) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(cout," ",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (cout,*(char **)(p_Var5 + 1),(long)p_Var5[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"=",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,*(char **)(p_Var5 + 2),(long)p_Var5[2]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      pXVar6 = xml->ptr;
    } while ((_Rb_tree_header *)p_Var5 != &(pXVar6->parms)._M_t._M_impl.super__Rb_tree_header);
  }
  if (((pXVar6->children).
       super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
       _M_impl.super__Vector_impl_data._M_finish ==
       (pXVar6->children).
       super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
       _M_impl.super__Vector_impl_data._M_start) &&
     ((pXVar6->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (pXVar6->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    std::__ostream_insert<char,std::char_traits<char>>(cout,"/>",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)cout + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    return cout;
  }
  std::__ostream_insert<char,std::char_traits<char>>(cout,">",1);
  pXVar6 = xml->ptr;
  pTVar8 = (pXVar6->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar7 = (pXVar6->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (((ulong)(((long)pTVar7 - (long)pTVar8 >> 3) * -0x71c71c71c71c71c7) < 0x10) &&
     ((pXVar6->children).
      super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (pXVar6->children).
      super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
      _M_impl.super__Vector_impl_data._M_start)) {
    bVar2 = true;
    bVar13 = true;
    if (pTVar7 == pTVar8) goto LAB_001aaf90;
LAB_001aaed3:
    if (pTVar7 != pTVar8) {
      lVar11 = 0;
      uVar12 = 0;
      do {
        poVar4 = operator<<(cout,(Token *)((long)&pTVar8->ty + lVar11));
        bVar13 = uVar12 != ((long)(xml->ptr->body).
                                  super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(xml->ptr->body).
                                  super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x71c71c71c71c71c7 - 1U;
        pcVar9 = "";
        if (bVar13) {
          pcVar9 = " ";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar9,(ulong)bVar13);
        uVar12 = uVar12 + 1;
        pXVar6 = xml->ptr;
        pTVar8 = (pXVar6->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar11 = lVar11 + 0x48;
      } while (uVar12 < (ulong)(((long)(pXVar6->body).
                                       super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar8 >>
                                3) * -0x71c71c71c71c71c7));
    }
    bVar13 = true;
    if (bVar2) goto LAB_001aaf90;
    std::ios::widen((char)*(undefined8 *)(*(long *)cout + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    pXVar6 = xml->ptr;
  }
  else {
    std::ios::widen((char)*(undefined8 *)(*(long *)cout + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    pXVar6 = xml->ptr;
    pTVar8 = (pXVar6->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar7 = (pXVar6->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar7 != pTVar8) {
      lVar11 = depth * 2 + 2;
      if (lVar11 != 0) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(cout," ",1);
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
        pXVar6 = xml->ptr;
        pTVar8 = (pXVar6->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pTVar7 = (pXVar6->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      bVar2 = false;
      goto LAB_001aaed3;
    }
  }
  bVar13 = false;
LAB_001aaf90:
  pRVar10 = (pXVar6->children).
            super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((pXVar6->children).
      super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pRVar10) {
    lVar11 = 0;
    uVar12 = 0;
    do {
      emitXML(cout,(Ref<embree::XML> *)((long)&pRVar10->ptr + lVar11),depth + 1);
      uVar12 = uVar12 + 1;
      pRVar10 = (xml->ptr->children).
                super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 8;
    } while (uVar12 < (ulong)((long)(xml->ptr->children).
                                    super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar10 >> 3)
            );
  }
  if (!bVar13) {
    for (lVar11 = depth * 2; lVar11 != 0; lVar11 = lVar11 + -1) {
      std::__ostream_insert<char,std::char_traits<char>>(cout," ",1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(cout,"</",2);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (cout,(xml->ptr->name)._M_dataplus._M_p,(xml->ptr->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,">",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  return poVar4;
}

Assistant:

std::ostream& emitXML(std::ostream& cout, const Ref<XML>& xml, size_t depth = 0)
  {
    /* print header */
    if (depth == 0) cout << "<?xml version=\"1.0\"?>" << std::endl << std::endl;

    /* print tag opening */
    indent(cout,depth); cout << "<" << xml->name;
    for (std::map<std::string,std::string>::const_iterator i=xml->parms.begin(); i!=xml->parms.end(); i++)
      cout << " " << i->first << "=" << "\"" << i->second << "\"";
    if (xml->children.size() == 0 && xml->body.size() == 0) {
      cout << "/>" << std::endl;
      return cout;
    }
    cout << ">";

    bool compact = xml->body.size() < 16 && xml->children.size() == 0;
    if (!compact) cout << std::endl;

    /* print token list */
    if (xml->body.size()) {
      if (!compact) indent(cout,depth+1);
      for (size_t i=0; i<xml->body.size(); i++)
        cout << xml->body[i] << (i!=xml->body.size()-1?" ":"");
      if (!compact) cout << std::endl;
    }

    /* print children */
    for (size_t i=0; i<xml->children.size(); i++)
      emitXML(cout,xml->children[i],depth+1);

    /* print tag closing */
    if (!compact) indent(cout,depth);
    return cout << "</" << xml->name << ">" << std::endl;
  }